

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

spirv_cross * __thiscall spirv_cross::ensure_valid_identifier(spirv_cross *this,string *name)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  reference pcVar5;
  char *c;
  iterator __end1;
  iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range1;
  string *name_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  
  ::std::__cxx11::string::find((char)name,0x28);
  ::std::__cxx11::string::substr((ulong)this,(ulong)name);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)this);
    bVar1 = is_numeric(*pcVar3);
    if (bVar1) {
      puVar4 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)this);
      *puVar4 = 0x5f;
    }
    __end1._M_current = (char *)::std::__cxx11::string::begin();
    c = (char *)::std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), bVar1) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
      bVar1 = is_alphanumeric(*pcVar5);
      if ((!bVar1) && (*pcVar5 != '_')) {
        *pcVar5 = '_';
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    ParsedIR::sanitize_underscores((string *)this);
  }
  return this;
}

Assistant:

static string ensure_valid_identifier(const string &name)
{
	// Functions in glslangValidator are mangled with name(<mangled> stuff.
	// Normally, we would never see '(' in any legal identifiers, so just strip them out.
	auto str = name.substr(0, name.find('('));

	if (str.empty())
		return str;

	if (is_numeric(str[0]))
		str[0] = '_';

	for (auto &c : str)
		if (!is_alphanumeric(c) && c != '_')
			c = '_';

	ParsedIR::sanitize_underscores(str);
	return str;
}